

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O2

void __thiscall sign_verify_generic::test_method(sign_verify_generic *this)

{
  int iVar1;
  size_type sVar2;
  array<unsigned_char,_32UL> *container;
  uint8_t *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  pointer *this_00;
  shared_count *psVar5;
  assertion_result local_568;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_550;
  size_t siglen;
  char *local_538;
  char *local_530;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized_private_key;
  undefined1 local_4e8 [16];
  undefined1 *local_4d8;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_4d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized_public_key;
  picnic_publickey_t gen_public_key;
  array<unsigned_char,_32UL> m;
  picnic_l3_fs_publickey_t public_key;
  picnic_l3_fs_privatekey_t private_key;
  picnic_privatekey_t gen_private_key;
  const_string local_360;
  const_string local_350;
  const_string local_340;
  const_string local_330;
  const_string local_320;
  const_string local_310;
  const_string local_300;
  const_string local_2f0;
  const_string local_2e0;
  const_string local_2d0;
  const_string local_2c0;
  const_string local_2b0;
  const_string local_2a0;
  const_string local_290;
  const_string local_280;
  const_string local_270;
  const_string local_260;
  const_string local_250;
  const_string local_240;
  const_string local_230;
  const_string local_220;
  const_string local_210;
  const_string local_200;
  const_string local_1f0;
  const_string local_1e0;
  const_string local_1d0;
  const_string local_1c0;
  const_string local_1b0;
  const_string local_1a0;
  const_string local_190;
  const_string local_180;
  const_string local_170;
  const_string local_160;
  const_string local_150;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  max_signature_size = picnic_l3_fs_signature_size();
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_50.m_begin = "";
  local_40.m_end = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this,&local_40,0x39,&local_50);
  public_key.data._0_8_ = &max_signature_size;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            ((assertion_result *)&private_key,(value_expr<const_unsigned_long_&> *)&public_key,false
            );
  gen_private_key.data._24_8_ = &gen_public_key;
  gen_public_key.data._0_8_ = (long)"siglen <= max_signature_size" + 10;
  gen_private_key.data[8] = '\0';
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_60.m_end = "";
  gen_public_key.data._8_8_ = (long)"siglen <= max_signature_size" + 0x1c;
  gen_private_key.data._0_8_ = &PTR__lazy_ostream_00177d30;
  gen_private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&private_key,(lazy_ostream *)&gen_private_key,&local_60,0x39,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count((shared_count *)(private_key.data + 0x10));
  container = &m;
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(container);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_80.m_begin = "";
  local_70.m_end = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)container,&local_70,0x41,&local_80);
  iVar1 = picnic_l3_fs_keygen(&public_key,&private_key);
  serialized_private_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(serialized_private_key.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&gen_public_key,(value_expr<bool> *)&serialized_private_key,false);
  local_4e8._0_8_ = "!picnic_l3_fs_keygen(&public_key, &private_key)";
  gen_private_key.data[8] = '\0';
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_90.m_end = "";
  local_4e8._8_8_ = "";
  gen_private_key.data._0_8_ = &PTR__lazy_ostream_00177d30;
  gen_private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  gen_private_key.data._24_8_ = local_4e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&gen_public_key,(lazy_ostream *)&gen_private_key,&local_90,0x41,
             CHECK,CHECK_BUILT_ASSERTION,0);
  puVar3 = gen_public_key.data + 0x10;
  boost::detail::shared_count::~shared_count((shared_count *)puVar3);
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_b0.m_begin = "";
  local_a0.m_end = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)puVar3,&local_a0,0x44,&local_b0);
  iVar1 = picnic_l3_fs_validate_keypair(&private_key,&public_key);
  serialized_private_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(serialized_private_key.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&gen_public_key,(value_expr<bool> *)&serialized_private_key,false);
  local_4e8._0_8_ = "!picnic_l3_fs_validate_keypair(&private_key, &public_key)";
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  gen_private_key.data[8] = '\0';
  local_c0.m_end = "";
  local_4e8._8_8_ = "";
  gen_private_key.data._0_8_ = &PTR__lazy_ostream_00177d30;
  gen_private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  gen_private_key.data._24_8_ = local_4e8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&gen_public_key,(lazy_ostream *)&gen_private_key,&local_c0,0x44,
             CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count((shared_count *)(gen_public_key.data + 0x10));
  serialized_private_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serialized_private_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  serialized_private_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar2 = picnic_l3_fs_get_private_key_size();
  pvVar4 = &serialized_private_key;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar4,sVar2);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_e0.m_begin = "";
  local_d0.m_end = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pvVar4,&local_d0,0x4b,&local_e0);
  iVar1 = picnic_l3_fs_write_private_key
                    (&private_key,
                     serialized_private_key.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)serialized_private_key.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)serialized_private_key.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_4e8._8_8_ =
       (long)serialized_private_key.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)serialized_private_key.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_4e8._0_4_ = iVar1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate((assertion_result *)&gen_public_key,
             (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)local_4e8,false);
  gen_private_key.data._24_8_ = &serialized_public_key;
  serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "picnic_l3_fs_write_private_key(&private_key, serialized_private_key.data(), serialized_private_key.size()) == serialized_private_key.size()"
  ;
  gen_private_key.data[8] = '\0';
  gen_private_key.data._0_8_ = &PTR__lazy_ostream_00177d30;
  gen_private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_f0.m_end = "";
  serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&gen_public_key,(lazy_ostream *)&gen_private_key,&local_f0,0x4b,
             CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count((shared_count *)(gen_public_key.data + 0x10));
  serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar2 = picnic_l3_fs_get_public_key_size();
  pvVar4 = &serialized_public_key;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar4,sVar2);
  local_100.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_110.m_begin = "";
  local_100.m_end = "";
  local_110.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pvVar4,&local_100,0x51,&local_110);
  local_4e8._0_4_ =
       picnic_l3_fs_write_public_key
                 (&public_key,
                  serialized_public_key.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)serialized_public_key.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)serialized_public_key.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  local_4e8._8_8_ =
       (long)serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)serialized_public_key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate((assertion_result *)&gen_public_key,
             (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)local_4e8,false);
  gen_private_key.data._24_8_ = &sig;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "picnic_l3_fs_write_public_key(&public_key, serialized_public_key.data(), serialized_public_key.size()) == serialized_public_key.size()"
  ;
  gen_private_key.data[8] = '\0';
  gen_private_key.data._0_8_ = &PTR__lazy_ostream_00177d30;
  gen_private_key.data._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_120.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_120.m_end = "";
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&gen_public_key,(lazy_ostream *)&gen_private_key,&local_120,0x51,
             CHECK,CHECK_BUILT_ASSERTION,0);
  puVar3 = gen_public_key.data + 0x10;
  boost::detail::shared_count::~shared_count((shared_count *)puVar3);
  local_130.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_140.m_begin = "";
  local_130.m_end = "";
  local_140.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)puVar3,&local_130,0x57,&local_140);
  iVar1 = picnic_read_private_key
                    (&gen_private_key,
                     serialized_private_key.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)serialized_private_key.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)serialized_private_key.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_550.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&sig,(value_expr<bool> *)&local_550,false);
  local_568._0_8_ =
       "!picnic_read_private_key(&gen_private_key, serialized_private_key.data(), serialized_private_key.size())"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_150.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_150.m_end = "";
  local_568.m_message.px = (element_type *)0x1513f4;
  local_4d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_568;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,(lazy_ostream *)local_4e8,&local_150,0x57,CHECK,
             CHECK_BUILT_ASSERTION,0);
  this_00 = &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  boost::detail::shared_count::~shared_count((shared_count *)this_00);
  local_160.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_170.m_begin = "";
  local_160.m_end = "";
  local_170.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_160,0x59,&local_170);
  iVar1 = picnic_read_public_key
                    (&gen_public_key,
                     serialized_public_key.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (long)serialized_public_key.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)serialized_public_key.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_550.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&sig,(value_expr<bool> *)&local_550,false);
  local_568._0_8_ =
       "!picnic_read_public_key(&gen_public_key, serialized_public_key.data(), serialized_public_key.size())"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_180.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_180.m_end = "";
  local_568.m_message.px = (element_type *)0x151459;
  local_4d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_568;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&sig,(lazy_ostream *)local_4e8,&local_180,0x59,CHECK,
             CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pvVar4 = &sig;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar4,max_signature_size);
  local_190.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_1a0.m_begin = "";
  local_190.m_end = "";
  local_1a0.m_end = "";
  siglen = max_signature_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)pvVar4,&local_190,0x60,&local_1a0);
  iVar1 = picnic_l3_fs_sign(&private_key,&m,0x20,
                            sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,&siglen);
  local_538 = (char *)CONCAT71(local_538._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_568,(value_expr<bool> *)&local_538,false);
  local_550.m_lhs.m_value = (unsigned_long *)0x1511a9;
  local_1b0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_1b0.m_end = "";
  local_550.m_rhs = (unsigned_long *)0x1511f2;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_550;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_1b0,0x60,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_1c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_1d0.m_begin = "";
  local_1c0.m_end = "";
  local_1d0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_1c0,0x61,&local_1d0);
  local_550.m_rhs = (unsigned_long *)((ulong)local_550.m_rhs & 0xffffffff00000000);
  local_550.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_568,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_550,false);
  local_538 = "siglen > 0";
  local_1e0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_1e0.m_end = "";
  local_530 = "";
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_538;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_1e0,0x61,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_1f0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_200.m_begin = "";
  local_1f0.m_end = "";
  local_200.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_1f0,0x62,&local_200);
  local_550.m_rhs = &max_signature_size;
  local_550.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_568,&local_550,false);
  local_538 = "siglen <= max_signature_size";
  local_210.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_210.m_end = "";
  local_530 = "";
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_538;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_210,0x62,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_220.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_230.m_begin = "";
  local_220.m_end = "";
  local_230.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_220,100,&local_230);
  iVar1 = picnic_l3_fs_verify(&public_key,&m,0x20,
                              sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,siglen);
  local_538._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_568,(value_expr<bool> *)&local_538,false);
  local_550.m_lhs.m_value = (unsigned_long *)0x15121b;
  local_240.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_240.m_end = "";
  local_550.m_rhs = (unsigned_long *)0x151264;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_550;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_240,100,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_250.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_260.m_begin = "";
  local_250.m_end = "";
  local_260.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_250,0x65,&local_260);
  iVar1 = picnic_verify(&gen_public_key,&m,0x20,
                        sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,siglen);
  local_538._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_568,(value_expr<bool> *)&local_538,false);
  local_550.m_lhs.m_value = (unsigned_long *)0x15145a;
  local_270.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_270.m_end = "";
  local_550.m_rhs = (unsigned_long *)0x1514a1;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_550;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_270,0x65,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_280.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_290.m_begin = "";
  local_280.m_end = "";
  local_290.m_end = "";
  siglen = max_signature_size;
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_280,0x69,&local_290);
  iVar1 = picnic_sign(&gen_private_key,&m,0x20,
                      sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,&siglen);
  local_538 = (char *)CONCAT71(local_538._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_568,(value_expr<bool> *)&local_538,false);
  local_550.m_lhs.m_value = (unsigned_long *)0x1514a2;
  local_2a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_2a0.m_end = "";
  local_550.m_rhs = (unsigned_long *)0x1514e9;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_550;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_2a0,0x69,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_2b0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2c0.m_begin = "";
  local_2b0.m_end = "";
  local_2c0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_2b0,0x6a,&local_2c0);
  local_550.m_rhs = (unsigned_long *)((ulong)local_550.m_rhs & 0xffffffff00000000);
  local_550.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_568,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_550,false);
  local_538 = "siglen > 0";
  local_2d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_2d0.m_end = "";
  local_530 = "";
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_538;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_2d0,0x6a,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_2e0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2f0.m_begin = "";
  local_2e0.m_end = "";
  local_2f0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_2e0,0x6b,&local_2f0);
  local_550.m_rhs = &max_signature_size;
  local_550.m_lhs.m_value = &siglen;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_568,&local_550,false);
  local_538 = "siglen <= max_signature_size";
  local_300.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_300.m_end = "";
  local_530 = "";
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_538;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_300,0x6b,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_310.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_320.m_begin = "";
  local_310.m_end = "";
  local_320.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_310,0x6d,&local_320);
  iVar1 = picnic_l3_fs_verify(&public_key,&m,0x20,
                              sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,siglen);
  local_538._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_568,(value_expr<bool> *)&local_538,false);
  local_550.m_lhs.m_value = (unsigned_long *)0x15121b;
  local_330.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_330.m_end = "";
  local_550.m_rhs = (unsigned_long *)0x151264;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_550;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_330,0x6d,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar5 = &local_568.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar5);
  local_340.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_350.m_begin = "";
  local_340.m_end = "";
  local_350.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar5,&local_340,0x6e,&local_350);
  iVar1 = picnic_verify(&gen_public_key,&m,0x20,
                        sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,siglen);
  local_538 = (char *)CONCAT71(local_538._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_568,(value_expr<bool> *)&local_538,false);
  local_550.m_lhs.m_value = (unsigned_long *)0x15145a;
  local_360.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
  local_360.m_end = "";
  local_550.m_rhs = (unsigned_long *)0x1514a1;
  local_4e8._0_8_ = &PTR__lazy_ostream_00177d30;
  local_4d8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = &local_550;
  boost::test_tools::tt_detail::report_assertion
            (&local_568,(lazy_ostream *)local_4e8,&local_360,0x6e,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_568.m_message.pn);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&serialized_public_key.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&serialized_private_key.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify_generic) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  // Serialize key pair
  std::vector<uint8_t> serialized_private_key;
  serialized_private_key.resize(PICNIC_CONCAT(PARAM, get_private_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_private_key)(&private_key, serialized_private_key.data(),
                                                     serialized_private_key.size()) ==
             serialized_private_key.size());

  std::vector<uint8_t> serialized_public_key;
  serialized_public_key.resize(PICNIC_CONCAT(PARAM, get_public_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_public_key)(&public_key, serialized_public_key.data(),
                                                    serialized_public_key.size()) ==
             serialized_public_key.size());

  // Deserialize key pair
  picnic_privatekey_t gen_private_key;
  picnic_publickey_t gen_public_key;
  BOOST_TEST(!picnic_read_private_key(&gen_private_key, serialized_private_key.data(),
                                      serialized_private_key.size()));
  BOOST_TEST(!picnic_read_public_key(&gen_public_key, serialized_public_key.data(),
                                     serialized_public_key.size()));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));

  siglen = max_signature_size;
  // Sign another message
  BOOST_TEST(!picnic_sign(&gen_private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));
}